

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

void ptc::(anonymous_namespace)::print_adaptor<std::vector<int,std::allocator<int>>,char>
               (basic_ostream<char,_std::char_traits<char>_> *os,
               vector<int,_std::allocator<int>_> *container)

{
  bool bVar1;
  conditional_t<std::is_same_v<char,_char>,_const_std::basic_string<char>_&,_std::basic_string<char>_>
  pbVar2;
  ostream *this;
  reference piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_78 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> separator;
  const_iterator beg;
  vector<int,_std::allocator<int>_> *container_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  separator.field_2._8_8_ = std::vector<int,_std::allocator<int>_>::begin(container);
  s_abi_cxx11_(&local_60,"",0);
  pbVar2 = anon_unknown_8::StringConverter<char>(&local_60);
  std::__cxx11::string::string(local_40,(string *)pbVar2);
  std::__cxx11::string::~string((string *)&local_60);
  while( true ) {
    local_78[0]._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(container);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       ((long)&separator.field_2 + 8),local_78);
    if (!bVar1) break;
    this = std::operator<<(os,local_40);
    local_80 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator++((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *
                          )((long)&separator.field_2 + 8),0);
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_80);
    std::ostream::operator<<(this,*piVar3);
    s_abi_cxx11_(&local_a0,", ",2);
    pbVar2 = anon_unknown_8::StringConverter<char>(&local_a0);
    std::__cxx11::string::operator=(local_40,(string *)pbVar2);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

inline void print_adaptor( std::basic_ostream<T_str>& os, const Container& container )
     {
      typename Container::const_iterator beg = container.begin();
      std::basic_string<T_str> separator = StringConverter<T_str>( ""s );
      
      while( beg != container.end() )
       {
        os << separator << *beg++;
        separator = StringConverter<T_str>( ", "s );
       }
     }